

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_named_interface_blocks.cpp
# Opt level: O3

glsl_type * process_array_type(glsl_type *type,uint idx)

{
  glsl_type *pgVar1;
  
  pgVar1 = (type->fields).array;
  if (pgVar1->field_0x4 == '\x11') {
    pgVar1 = process_array_type(pgVar1,idx);
  }
  else {
    pgVar1 = *(glsl_type **)((pgVar1->fields).array + idx);
  }
  pgVar1 = glsl_type::get_array_instance(pgVar1,type->length,0);
  return pgVar1;
}

Assistant:

static const glsl_type *
process_array_type(const glsl_type *type, unsigned idx)
{
   const glsl_type *element_type = type->fields.array;
   if (element_type->is_array()) {
      const glsl_type *new_array_type = process_array_type(element_type, idx);
      return glsl_type::get_array_instance(new_array_type, type->length);
   } else {
      return glsl_type::get_array_instance(
         element_type->fields.structure[idx].type, type->length);
   }
}